

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindowSettings * ImGui::FindWindowSettingsByWindow(ImGuiWindow *window)

{
  ImGuiWindowSettings *pIVar1;
  
  if ((long)window->SettingsOffset != -1) {
    return (ImGuiWindowSettings *)((GImGui->SettingsWindows).Buf.Data + window->SettingsOffset);
  }
  pIVar1 = FindWindowSettingsByID(window->ID);
  return pIVar1;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettingsByWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (window->SettingsOffset != -1)
        return g.SettingsWindows.ptr_from_offset(window->SettingsOffset);
    return FindWindowSettingsByID(window->ID);
}